

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O0

int anon_unknown.dwarf_67a627::MapSpvVersionToIndex(SpvVersion *spvVersion)

{
  uint local_14;
  int index;
  SpvVersion *spvVersion_local;
  
  local_14 = 0;
  if (spvVersion->openGl < 1) {
    if (0 < spvVersion->vulkan) {
      if ((spvVersion->vulkanRelaxed & 1U) == 0) {
        local_14 = 2;
      }
      else {
        local_14 = 3;
      }
    }
  }
  else {
    local_14 = 1;
  }
  if (3 < local_14) {
    __assert_fail("index < SpvVersionCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ShaderLang.cpp"
                  ,0xb7,"int (anonymous namespace)::MapSpvVersionToIndex(const SpvVersion &)");
  }
  return local_14;
}

Assistant:

int MapSpvVersionToIndex(const SpvVersion& spvVersion)
{
    int index = 0;

    if (spvVersion.openGl > 0)
        index = 1;
    else if (spvVersion.vulkan > 0) {
        if (!spvVersion.vulkanRelaxed)
            index = 2;
        else
            index = 3;
    }

    assert(index < SpvVersionCount);

    return index;
}